

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

uECC_word_t regularize_k(uECC_word_t *k,uECC_word_t *k0,uECC_word_t *k1,uECC_Curve curve)

{
  wordcount_t num_words;
  uECC_word_t uVar1;
  uint uVar2;
  
  uVar2 = (uint)curve->num_n_bits;
  num_words = (wordcount_t)((int)(uVar2 + 0x3f) / 0x40);
  uVar1 = uECC_vli_add(k0,k,curve->n,num_words);
  if (uVar1 == 0) {
    if ((int)uVar2 < num_words * 0x40) {
      uVar1 = (uECC_word_t)((k0[(int)uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0);
    }
    else {
      uVar1 = 0;
    }
  }
  else {
    uVar1 = 1;
  }
  uECC_vli_add(k1,k0,curve->n,num_words);
  return uVar1;
}

Assistant:

static uECC_word_t regularize_k(const uECC_word_t * const k,
                                uECC_word_t *k0,
                                uECC_word_t *k1,
                                uECC_Curve curve) {
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;
    uECC_word_t carry = uECC_vli_add(k0, k, curve->n, num_n_words) ||
        (num_n_bits < ((bitcount_t)num_n_words * uECC_WORD_SIZE * 8) &&
         uECC_vli_testBit(k0, num_n_bits));
    uECC_vli_add(k1, k0, curve->n, num_n_words);
    return carry;
}